

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O1

void MurmurHash3_x64_128(void *key,int len,uint32_t seed,void *out)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = len + 0xf;
  if (-1 < len) {
    iVar6 = len;
  }
  uVar5 = (ulong)seed;
  uVar4 = uVar5;
  if (0xf < len) {
    lVar7 = 0;
    do {
      lVar1 = *(long *)((long)key + lVar7 + 8);
      uVar4 = ((ulong)(*(long *)((long)key + lVar7) * -0x783c846eeebdac2b) >> 0x21 |
              *(long *)((long)key + lVar7) * -0x775ed61580000000) * 0x4cf5ad432745937f ^ uVar4;
      lVar2 = (uVar4 >> 0x25 | uVar4 << 0x1b) + uVar5;
      uVar4 = lVar2 * 5 + 0x52dce729;
      uVar5 = ((ulong)(lVar1 * 0x4cf5ad432745937f) >> 0x1f | lVar1 * 0x4e8b26fe00000000) *
              -0x783c846eeebdac2b ^ uVar5;
      uVar5 = ((uVar5 >> 0x21 | uVar5 << 0x1f) + lVar2 * 5 + 0x52dce729) * 5 + 0x38495ab5;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uint)(iVar6 >> 4) << 4 != lVar7);
  }
  lVar7 = (long)(iVar6 >> 4) * 0x10;
  uVar3 = 0;
  switch(len & 0xf) {
  case 0xf:
    uVar3 = (ulong)*(byte *)((long)key + lVar7 + 0xe) << 0x30;
  case 0xe:
    uVar3 = uVar3 | (ulong)*(byte *)((long)key + lVar7 + 0xd) << 0x28;
  case 0xd:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar7 + 0xc) << 0x20;
  case 0xc:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar7 + 0xb) << 0x18;
  case 0xb:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar7 + 10) << 0x10;
  case 10:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar7 + 9) << 8;
  case 9:
    uVar3 = *(byte *)((long)key + lVar7 + 8) ^ uVar3;
    uVar5 = uVar5 ^ (uVar3 * 0x4cf5ad432745937f >> 0x1f | uVar3 * 0x4e8b26fe00000000) *
                    -0x783c846eeebdac2b;
  case 8:
    uVar3 = (ulong)*(byte *)((long)key + lVar7 + 7) << 0x38;
  case 7:
    uVar3 = uVar3 | (ulong)*(byte *)((long)key + lVar7 + 6) << 0x30;
  case 6:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar7 + 5) << 0x28;
  case 5:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar7 + 4) << 0x20;
  case 4:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar7 + 3) << 0x18;
  case 3:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar7 + 2) << 0x10;
  case 2:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar7 + 1) << 8;
  case 1:
    uVar3 = *(byte *)((long)key + lVar7) ^ uVar3;
    uVar4 = uVar4 ^ (uVar3 * -0x783c846eeebdac2b >> 0x21 | uVar3 * -0x775ed61580000000) *
                    0x4cf5ad432745937f;
  case 0:
    uVar5 = uVar5 ^ (long)len;
    uVar4 = (uVar4 ^ (long)len) + uVar5;
    uVar5 = uVar5 + uVar4;
    uVar4 = (uVar4 >> 0x21 ^ uVar4) * -0xae502812aa7333;
    uVar3 = (uVar4 >> 0x21 ^ uVar4) * -0x3b314601e57a13ad;
    uVar4 = (uVar5 >> 0x21 ^ uVar5) * -0xae502812aa7333;
    uVar4 = (uVar4 >> 0x21 ^ uVar4) * -0x3b314601e57a13ad;
    uVar4 = uVar4 >> 0x21 ^ uVar4;
    lVar7 = (uVar3 >> 0x21 ^ uVar3) + uVar4;
    *(long *)out = lVar7;
    *(ulong *)((long)out + 8) = uVar4 + lVar7;
    return;
  }
}

Assistant:

void MurmurHash3_x64_128(const void* key, const int len,
	const uint32_t seed, void* out)
{
	const uint8_t* data = (const uint8_t*)key;
	const int nblocks = len / 16;

	uint64_t h1 = seed;
	uint64_t h2 = seed;

	const uint64_t c1 = BIG_CONSTANT(0x87c37b91114253d5);
	const uint64_t c2 = BIG_CONSTANT(0x4cf5ad432745937f);

	const uint64_t* blocks = (const uint64_t*)(data);

	for (int i = 0; i < nblocks; i++)
	{
		uint64_t k1 = getblock64(blocks, i * 2 + 0);
		uint64_t k2 = getblock64(blocks, i * 2 + 1);

		k1 *= c1; k1 = ROTL64(k1, 31); k1 *= c2; h1 ^= k1;
		h1 = ROTL64(h1, 27); h1 += h2; h1 = h1 * 5 + 0x52dce729;
		k2 *= c2; k2 = ROTL64(k2, 33); k2 *= c1; h2 ^= k2;
		h2 = ROTL64(h2, 31); h2 += h1; h2 = h2 * 5 + 0x38495ab5;
	}

	const uint8_t* tail = (const uint8_t*)(data + nblocks * 16);

	uint64_t k1 = 0;
	uint64_t k2 = 0;

	switch (len & 15)
	{
	case 15: k2 ^= ((uint64_t)tail[14]) << 48;
	case 14: k2 ^= ((uint64_t)tail[13]) << 40;
	case 13: k2 ^= ((uint64_t)tail[12]) << 32;
	case 12: k2 ^= ((uint64_t)tail[11]) << 24;
	case 11: k2 ^= ((uint64_t)tail[10]) << 16;
	case 10: k2 ^= ((uint64_t)tail[9]) << 8;
	case  9: k2 ^= ((uint64_t)tail[8]) << 0;
		k2 *= c2; k2 = ROTL64(k2, 33); k2 *= c1; h2 ^= k2;

	case  8: k1 ^= ((uint64_t)tail[7]) << 56;
	case  7: k1 ^= ((uint64_t)tail[6]) << 48;
	case  6: k1 ^= ((uint64_t)tail[5]) << 40;
	case  5: k1 ^= ((uint64_t)tail[4]) << 32;
	case  4: k1 ^= ((uint64_t)tail[3]) << 24;
	case  3: k1 ^= ((uint64_t)tail[2]) << 16;
	case  2: k1 ^= ((uint64_t)tail[1]) << 8;
	case  1: k1 ^= ((uint64_t)tail[0]) << 0;
		k1 *= c1; k1 = ROTL64(k1, 31); k1 *= c2; h1 ^= k1;
	};
	h1 ^= len; h2 ^= len;

	h1 += h2;
	h2 += h1;

	h1 = fmix64(h1);
	h2 = fmix64(h2);

	h1 += h2;
	h2 += h1;

	((uint64_t*)out)[0] = h1;
	((uint64_t*)out)[1] = h2;
}